

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange
          (ImageFeatureType_ImageSizeRange *this,ImageFeatureType_ImageSizeRange *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  SizeRange *pSVar2;
  ImageFeatureType_ImageSizeRange *from_local;
  ImageFeatureType_ImageSizeRange *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ImageFeatureType_ImageSizeRange_0056a440;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_widthrange(from);
  if (bVar1) {
    pSVar2 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(pSVar2,from->widthrange_);
    this->widthrange_ = pSVar2;
  }
  else {
    this->widthrange_ = (SizeRange *)0x0;
  }
  bVar1 = has_heightrange(from);
  if (bVar1) {
    pSVar2 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(pSVar2,from->heightrange_);
    this->heightrange_ = pSVar2;
  }
  else {
    this->heightrange_ = (SizeRange *)0x0;
  }
  return;
}

Assistant:

ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange(const ImageFeatureType_ImageSizeRange& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_widthrange()) {
    widthrange_ = new ::CoreML::Specification::SizeRange(*from.widthrange_);
  } else {
    widthrange_ = NULL;
  }
  if (from.has_heightrange()) {
    heightrange_ = new ::CoreML::Specification::SizeRange(*from.heightrange_);
  } else {
    heightrange_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ImageFeatureType.ImageSizeRange)
}